

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void ProcessThread::wakeup(Signal sig)

{
  ssize_t sVar1;
  int *piVar2;
  char b;
  byte local_19;
  
  local_19 = (sig == Stop) << 4 | 99;
  sVar1 = write(sProcessPipe[1],&local_19,1);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    do {
      if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
        return;
      }
      sVar1 = write(sProcessPipe[1],&local_19,1);
    } while (sVar1 < 0);
  }
  return;
}

Assistant:

void ProcessThread::wakeup(Signal sig)
{
    const char b = sig == Stop ? 's' : 'c';
    // printf("sending pid %d\n", pid);
    do {
        if (::write(sProcessPipe[1], &b, sizeof(char)) >= 0)
            break;
    } while (errno == EINTR || errno == EAGAIN || errno == EWOULDBLOCK);
    // printf("sent pid %ld\n", written);
}